

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O1

void CMU462::Collada::ColladaWriter::writeVisualScenes(ofstream *out,Scene *scene)

{
  char cVar1;
  long lVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  int iVar5;
  int iVar6;
  _Rb_tree_header *p_Var7;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"   <library_visual_scenes>",0x1a);
  cVar1 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"      <visual_scene id=\"ScottyScene\">",0x25);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  p_Var4 = (scene->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(scene->objects)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var7) {
    iVar5 = 0;
    iVar6 = 0;
    do {
      if (*(long *)(p_Var4 + 1) != 0) {
        lVar2 = __dynamic_cast(*(long *)(p_Var4 + 1),&DynamicScene::SceneObject::typeinfo,
                               &DynamicScene::Mesh::typeinfo,0);
        if (lVar2 != 0) {
          iVar5 = iVar5 + 1;
          iVar6 = iVar6 + 1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)out,"         <node id=\"N",0x14);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)out,iVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" name=\"Node",0xc);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\">",2);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)out,"            <instance_geometry url=\"#M",0x26);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)out,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\">",2);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)out,"            </instance_geometry>",0x20);
          std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
          std::ostream::put(cVar1);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"         </node>",0x10)
          ;
          std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
          std::ostream::put(cVar1);
          std::ostream::flush();
        }
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"      </visual_scene>",0x15);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"   </library_visual_scenes>",0x1b);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"   <scene>",10);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"      <instance_visual_scene url=\"#ScottyScene\"/>",0x31);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"   </scene>",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  return;
}

Assistant:

void ColladaWriter::writeVisualScenes( ofstream& out, DynamicScene::Scene& scene )
{
   out << "   <library_visual_scenes>" << endl;
   out << "      <visual_scene id=\"ScottyScene\">" << endl;

   int nMeshes = 0;
   int nNodes = 0;
   for( auto o : scene.objects )
   {
      DynamicScene::Mesh* mesh = dynamic_cast<DynamicScene::Mesh*>( o );
      if( mesh )
      {
         nMeshes++;
         nNodes++;
         out << "         <node id=\"N" << nNodes << "\" name=\"Node" << nNodes << "\">" << endl;
         out << "            <instance_geometry url=\"#M" << nMeshes << "\">" << endl;
         out << "            </instance_geometry>" << endl;
         out << "         </node>" << endl;
      }
   }

   out << "      </visual_scene>" << endl;
   out << "   </library_visual_scenes>" << endl;

   out << "   <scene>" << endl;
   out << "      <instance_visual_scene url=\"#ScottyScene\"/>" << endl;
   out << "   </scene>" << endl;
}